

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawPartialSprite
          (PixelGameEngine *this,int32_t x,int32_t y,Sprite *sprite,int32_t ox,int32_t oy,int32_t w,
          int32_t h,uint32_t scale,uint8_t flip)

{
  Pixel PVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  int32_t iVar7;
  uint uVar8;
  uint uVar9;
  uint32_t js;
  uint32_t uVar10;
  int y_00;
  int local_90;
  
  if (sprite != (Sprite *)0x0) {
    uVar2 = -(flip & 1);
    uVar9 = w - 1U & uVar2;
    uVar2 = uVar2 | 1;
    uVar6 = h - 1U & (int)((uint)flip << 0x1e) >> 0x1f;
    uVar3 = -(uint)((flip >> 1 & 1) != 0) | 1;
    if (scale < 2) {
      if (0 < w) {
        iVar5 = 0;
        do {
          if (0 < h) {
            y_00 = uVar6 + oy;
            uVar8 = y;
            iVar7 = h;
            do {
              PVar1 = Sprite::GetPixel(sprite,uVar9 + ox,y_00);
              (*this->_vptr_PixelGameEngine[5])
                        (this,(ulong)(uint)(x + iVar5),(ulong)uVar8,(ulong)(uint)PVar1.field_0);
              uVar8 = uVar8 + 1;
              y_00 = y_00 + uVar3;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
          iVar5 = iVar5 + 1;
          uVar9 = uVar9 + uVar2;
        } while (iVar5 != w);
      }
    }
    else if (0 < w) {
      local_90 = 0;
      do {
        if (0 < h) {
          iVar5 = 0;
          iVar7 = y;
          uVar8 = uVar6;
          do {
            uVar4 = 0;
            do {
              uVar10 = 0;
              do {
                PVar1 = Sprite::GetPixel(sprite,uVar9 + ox,uVar8 + oy);
                (*this->_vptr_PixelGameEngine[5])
                          (this,(ulong)(local_90 * scale + x + uVar4),(ulong)(iVar7 + uVar10),
                           (ulong)(uint)PVar1.field_0);
                uVar10 = uVar10 + 1;
              } while (scale != uVar10);
              uVar4 = uVar4 + 1;
            } while (uVar4 != scale);
            iVar5 = iVar5 + 1;
            uVar8 = uVar8 + uVar3;
            iVar7 = iVar7 + scale;
          } while (iVar5 != h);
        }
        local_90 = local_90 + 1;
        uVar9 = uVar9 + uVar2;
      } while (local_90 != w);
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawPartialSprite(int32_t x, int32_t y, Sprite *sprite, int32_t ox, int32_t oy, int32_t w, int32_t h, uint32_t scale, uint8_t flip)
	{
		if (sprite == nullptr)
			return;

		int32_t fxs = 0, fxm = 1, fx = 0;
		int32_t fys = 0, fym = 1, fy = 0;
		if (flip & olc::Sprite::Flip::HORIZ)
		{
			fxs = w - 1;
			fxm = -1;
		}
		if (flip & olc::Sprite::Flip::VERT)
		{
			fys = h - 1;
			fym = -1;
		}

		if (scale > 1)
		{
			fx = fxs;
			for (int32_t i = 0; i < w; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < h; j++, fy += fym)
					for (uint32_t is = 0; is < scale; is++)
						for (uint32_t js = 0; js < scale; js++)
							Draw(x + (i * scale) + is, y + (j * scale) + js, sprite->GetPixel(fx + ox, fy + oy));
			}
		}
		else
		{
			fx = fxs;
			for (int32_t i = 0; i < w; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < h; j++, fy += fym)
					Draw(x + i, y + j, sprite->GetPixel(fx + ox, fy + oy));
			}
		}
	}